

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_bigint<std::allocator<unsigned_char>>::
write_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_bigint<std::allocator<unsigned_char>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  pointer pcVar1;
  uint64_t *puVar2;
  uint64_t uVar3;
  char cVar4;
  ulong uVar5;
  bool bVar6;
  basic_bigint<std::allocator<unsigned_char>_> v;
  basic_bigint<std::allocator<unsigned_char>_> R;
  basic_bigint<std::allocator<unsigned_char>_> LP10;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
            (&v,(basic_bigint<std::allocator<unsigned_char>_> *)this);
  std::__cxx11::string::reserve((ulong)data);
  cVar4 = (char)data;
  if (v.field_0.common_stor_.length_ == 0) {
    std::__cxx11::string::push_back(cVar4);
  }
  else {
    if (basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 == 1) {
      uVar5 = 1;
      do {
        basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 = uVar5 * 10;
        basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 =
             basic_bigint<std::allocator<unsigned_char>_>::
             write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 + 1;
        bVar6 = uVar5 < 0x28f5c28f5c28f5d;
        uVar5 = basic_bigint<std::allocator<unsigned_char>_>::
                write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10;
      } while (bVar6);
    }
    R.field_0._0_1_ = 0;
    R.field_0.short_stor_.values_[1] = 0;
    R.field_0.common_stor_.length_ = 0;
    R.field_0.short_stor_.values_[0] = 0;
    LP10.field_0._0_1_ = 0;
    LP10.field_0.common_stor_.length_ =
         (size_type)
         (basic_bigint<std::allocator<unsigned_char>_>::
          write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 != 0);
    LP10.field_0.short_stor_.values_[1] = 0;
    LP10.field_0.short_stor_.values_[0] =
         basic_bigint<std::allocator<unsigned_char>_>::
         write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10;
    do {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_58,&LP10);
      basic_bigint<std::allocator<unsigned_char>_>::divide(&v,&local_58,&v,&R,true);
      basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_58);
      if (R.field_0.common_stor_.length_ == 0) {
        uVar3 = 0;
      }
      else {
        puVar2 = basic_bigint<std::allocator<unsigned_char>_>::data(&R);
        uVar3 = *puVar2;
      }
      uVar5 = 0xffffffffffffffff;
      do {
        uVar5 = uVar5 + 1;
        if (basic_bigint<std::allocator<unsigned_char>_>::
            write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 <= uVar5) break;
        uVar3 = uVar3 / 10;
        std::__cxx11::string::push_back(cVar4);
      } while (uVar3 + v.field_0.common_stor_.length_ != 0);
    } while (v.field_0.common_stor_.length_ != 0);
    if (((byte)this[8] & 2) != 0) {
      std::__cxx11::string::push_back(cVar4);
    }
    pcVar1 = (data->_M_dataplus)._M_p;
    std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (pcVar1,pcVar1 + data->_M_string_length);
    basic_bigint<std::allocator<unsigned_char>_>::destroy(&LP10);
    basic_bigint<std::allocator<unsigned_char>_>::destroy(&R);
  }
  basic_bigint<std::allocator<unsigned_char>_>::destroy(&v);
  return;
}

Assistant:

void write_string(std::basic_string<Ch,Traits,Alloc>& data) const
    {
        basic_bigint<Allocator> v(*this);

        std::size_t len = (v.length() * basic_type_bits / 3) + 2;
        data.reserve(len);

        static uint64_t p10 = 1;
        static uint64_t ip10 = 0;

        if ( v.length() == 0 )
        {
            data.push_back('0');
        }
        else
        {
            uint64_t r;
            if ( p10 == 1 )
            {
                while ( p10 <= max_uint64_div_10)
                {
                    p10 *= 10u;
                    ip10++;
                }
            }                     
            // p10 is max unsigned power of 10
            basic_bigint<Allocator> R;
            basic_bigint<Allocator> LP10 = p10; // LP10 = p10 = ::pow(10, ip10)

            do
            {
                v.divide( LP10, v, R, true );
                r = (R.length() ? R.data()[0] : 0);
                for ( size_type j=0; j < ip10; j++ )
                {
                    data.push_back(char(r % 10u + '0'));
                    r /= 10u;
                    if ( r + v.length() == 0 )
                        break;
                }
            } 
            while ( v.length() );
            if (is_negative())
            {
                data.push_back('-');
            }
            std::reverse(data.begin(),data.end());
        }
    }